

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void PackAndStore565_SSE2(__m128i *R,__m128i *G,__m128i *B,uint8_t *dst)

{
  char cVar1;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  ushort uVar21;
  undefined4 uVar22;
  undefined6 uVar23;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  ulong uVar24;
  undefined1 auVar25 [16];
  __m128i g0;
  __m128i r0;
  ulong local_2d8;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  undefined1 local_1e8;
  undefined1 uStack_1e7;
  undefined1 uStack_1e6;
  undefined1 uStack_1e5;
  undefined1 uStack_1e4;
  undefined1 uStack_1e3;
  undefined1 uStack_1e2;
  undefined1 uStack_1e1;
  undefined1 local_1d8;
  undefined1 uStack_1d7;
  undefined1 uStack_1d6;
  undefined1 uStack_1d5;
  undefined1 uStack_1d4;
  undefined1 uStack_1d3;
  undefined1 uStack_1d2;
  undefined1 uStack_1d1;
  ushort local_1b8;
  ushort uStack_1b6;
  ushort uStack_1b4;
  ushort uStack_1b2;
  ushort uStack_196;
  ushort uStack_194;
  ushort uStack_192;
  __m128i rgb565;
  __m128i gb;
  __m128i rg;
  __m128i g2;
  __m128i g1;
  __m128i b1;
  __m128i r1;
  __m128i b0;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  
  uVar15 = *in_RDI;
  uVar16 = in_RDI[1];
  local_1f8 = (short)uVar15;
  sStack_1f6 = (short)((ulong)uVar15 >> 0x10);
  sStack_1f4 = (short)((ulong)uVar15 >> 0x20);
  sStack_1f2 = (short)((ulong)uVar15 >> 0x30);
  sStack_1f0 = (short)uVar16;
  sStack_1ee = (short)((ulong)uVar16 >> 0x10);
  sStack_1ec = (short)((ulong)uVar16 >> 0x20);
  sStack_1ea = (short)((ulong)uVar16 >> 0x30);
  uVar17 = *in_RSI;
  uVar18 = in_RSI[1];
  local_218 = (short)uVar17;
  sStack_216 = (short)((ulong)uVar17 >> 0x10);
  sStack_214 = (short)((ulong)uVar17 >> 0x20);
  sStack_212 = (short)((ulong)uVar17 >> 0x30);
  sStack_210 = (short)uVar18;
  sStack_20e = (short)((ulong)uVar18 >> 0x10);
  sStack_20c = (short)((ulong)uVar18 >> 0x20);
  sStack_20a = (short)((ulong)uVar18 >> 0x30);
  cVar1 = (0 < local_218) * (local_218 < 0x100) * (char)uVar17 - (0xff < local_218);
  cVar9 = (char)((ulong)uVar17 >> 0x10);
  cVar2 = (0 < sStack_216) * (sStack_216 < 0x100) * cVar9 - (0xff < sStack_216);
  cVar10 = (char)((ulong)uVar17 >> 0x20);
  cVar3 = (0 < sStack_214) * (sStack_214 < 0x100) * cVar10 - (0xff < sStack_214);
  cVar11 = (char)((ulong)uVar17 >> 0x30);
  cVar4 = (0 < sStack_212) * (sStack_212 < 0x100) * cVar11 - (0xff < sStack_212);
  cVar5 = (0 < sStack_210) * (sStack_210 < 0x100) * (char)uVar18 - (0xff < sStack_210);
  cVar12 = (char)((ulong)uVar18 >> 0x10);
  cVar6 = (0 < sStack_20e) * (sStack_20e < 0x100) * cVar12 - (0xff < sStack_20e);
  cVar13 = (char)((ulong)uVar18 >> 0x20);
  cVar7 = (0 < sStack_20c) * (sStack_20c < 0x100) * cVar13 - (0xff < sStack_20c);
  cVar14 = (char)((ulong)uVar18 >> 0x30);
  cVar8 = (0 < sStack_20a) * (sStack_20a < 0x100) * cVar14 - (0xff < sStack_20a);
  uVar19 = *in_RDX;
  uVar20 = in_RDX[1];
  local_238 = (short)uVar19;
  sStack_236 = (short)((ulong)uVar19 >> 0x10);
  sStack_234 = (short)((ulong)uVar19 >> 0x20);
  sStack_232 = (short)((ulong)uVar19 >> 0x30);
  sStack_230 = (short)uVar20;
  sStack_22e = (short)((ulong)uVar20 >> 0x10);
  sStack_22c = (short)((ulong)uVar20 >> 0x20);
  sStack_22a = (short)((ulong)uVar20 >> 0x30);
  uVar21 = CONCAT11((0 < sStack_236) * (sStack_236 < 0x100) * (char)((ulong)uVar19 >> 0x10) -
                    (0xff < sStack_236),
                    (0 < local_238) * (local_238 < 0x100) * (char)uVar19 - (0xff < local_238));
  uVar22 = CONCAT13((0 < sStack_232) * (sStack_232 < 0x100) * (char)((ulong)uVar19 >> 0x30) -
                    (0xff < sStack_232),
                    CONCAT12((0 < sStack_234) * (sStack_234 < 0x100) * (char)((ulong)uVar19 >> 0x20)
                             - (0xff < sStack_234),uVar21));
  uVar23 = CONCAT15((0 < sStack_22e) * (sStack_22e < 0x100) * (char)((ulong)uVar20 >> 0x10) -
                    (0xff < sStack_22e),
                    CONCAT14((0 < sStack_230) * (sStack_230 < 0x100) * (char)uVar20 -
                             (0xff < sStack_230),uVar22));
  uVar24 = CONCAT17(cVar8,CONCAT16(cVar7,CONCAT15(cVar6,CONCAT14(cVar5,CONCAT13(cVar4,CONCAT12(cVar3
                                                  ,CONCAT11(cVar2,cVar1))))))) & 0xe0e0e0e0e0e0e0e0;
  local_1b8 = (ushort)uVar24;
  uStack_1b6 = (ushort)(uVar24 >> 0x10);
  uStack_1b4 = (ushort)(uVar24 >> 0x20);
  auVar25._8_8_ =
       CONCAT17((0 < sStack_20a) * (sStack_20a < 0x100) * cVar14 - (0xff < sStack_20a),
                CONCAT16((0 < sStack_20c) * (sStack_20c < 0x100) * cVar13 - (0xff < sStack_20c),
                         CONCAT15((0 < sStack_20e) * (sStack_20e < 0x100) * cVar12 -
                                  (0xff < sStack_20e),
                                  CONCAT14((0 < sStack_210) * (sStack_210 < 0x100) * (char)uVar18 -
                                           (0xff < sStack_210),
                                           CONCAT13((0 < sStack_212) * (sStack_212 < 0x100) * cVar11
                                                    - (0xff < sStack_212),
                                                    CONCAT12((0 < sStack_214) * (sStack_214 < 0x100)
                                                             * cVar10 - (0xff < sStack_214),
                                                             CONCAT11((0 < sStack_216) *
                                                                      (sStack_216 < 0x100) * cVar9 -
                                                                      (0xff < sStack_216),
                                                                      (0 < local_218) *
                                                                      (local_218 < 0x100) *
                                                                      (char)uVar17 -
                                                                      (0xff < local_218)))))))) &
       0x1c1c1c1c1c1c1c1c;
  auVar25._0_8_ =
       CONCAT17(cVar8,CONCAT16(cVar7,CONCAT15(cVar6,CONCAT14(cVar5,CONCAT13(cVar4,CONCAT12(cVar3,
                                                  CONCAT11(cVar2,cVar1))))))) & 0x1c1c1c1c1c1c1c1c;
  auVar25 = psllw(auVar25,ZEXT416(3));
  uVar24 = CONCAT17((0 < sStack_1ea) * (sStack_1ea < 0x100) * (char)((ulong)uVar16 >> 0x30) -
                    (0xff < sStack_1ea),
                    CONCAT16((0 < sStack_1ec) * (sStack_1ec < 0x100) * (char)((ulong)uVar16 >> 0x20)
                             - (0xff < sStack_1ec),
                             CONCAT15((0 < sStack_1ee) * (sStack_1ee < 0x100) *
                                      (char)((ulong)uVar16 >> 0x10) - (0xff < sStack_1ee),
                                      CONCAT14((0 < sStack_1f0) * (sStack_1f0 < 0x100) *
                                               (char)uVar16 - (0xff < sStack_1f0),
                                               CONCAT13((0 < sStack_1f2) * (sStack_1f2 < 0x100) *
                                                        (char)((ulong)uVar15 >> 0x30) -
                                                        (0xff < sStack_1f2),
                                                        CONCAT12((0 < sStack_1f4) *
                                                                 (sStack_1f4 < 0x100) *
                                                                 (char)((ulong)uVar15 >> 0x20) -
                                                                 (0xff < sStack_1f4),
                                                                 CONCAT11((0 < sStack_1f6) *
                                                                          (sStack_1f6 < 0x100) *
                                                                          (char)((ulong)uVar15 >>
                                                                                0x10) -
                                                                          (0xff < sStack_1f6),
                                                                          (0 < local_1f8) *
                                                                          (local_1f8 < 0x100) *
                                                                          (char)uVar15 -
                                                                          (0xff < local_1f8))))))))
           & 0xf8f8f8f8f8f8f8f8 |
           CONCAT26((ushort)(uVar24 >> 0x35),
                    CONCAT24(uStack_1b4 >> 5,CONCAT22(uStack_1b6 >> 5,local_1b8 >> 5)));
  local_2d8 = auVar25._0_8_;
  local_2d8 = local_2d8 |
              CONCAT26((ushort)(CONCAT17((0 < sStack_22a) * (sStack_22a < 0x100) *
                                         (char)((ulong)uVar20 >> 0x30) - (0xff < sStack_22a),
                                         CONCAT16((0 < sStack_22c) * (sStack_22c < 0x100) *
                                                  (char)((ulong)uVar20 >> 0x20) -
                                                  (0xff < sStack_22c),uVar23)) >> 0x33),
                       CONCAT24((ushort)((uint6)uVar23 >> 0x23),
                                CONCAT22((ushort)((uint)uVar22 >> 0x13),uVar21 >> 3))) &
              0x1f1f1f1f1f1f1f1f;
  local_1d8 = (undefined1)uVar24;
  uStack_1d7 = (undefined1)(uVar24 >> 8);
  uStack_1d6 = (undefined1)(uVar24 >> 0x10);
  uStack_1d5 = (undefined1)(uVar24 >> 0x18);
  uStack_1d4 = (undefined1)(uVar24 >> 0x20);
  uStack_1d3 = (undefined1)(uVar24 >> 0x28);
  uStack_1d2 = (undefined1)(uVar24 >> 0x30);
  uStack_1d1 = (undefined1)(uVar24 >> 0x38);
  local_1e8 = (undefined1)local_2d8;
  uStack_1e7 = (undefined1)(local_2d8 >> 8);
  uStack_1e6 = (undefined1)(local_2d8 >> 0x10);
  uStack_1e5 = (undefined1)(local_2d8 >> 0x18);
  uStack_1e4 = (undefined1)(local_2d8 >> 0x20);
  uStack_1e3 = (undefined1)(local_2d8 >> 0x28);
  uStack_1e2 = (undefined1)(local_2d8 >> 0x30);
  uStack_1e1 = (undefined1)(local_2d8 >> 0x38);
  *in_RCX = CONCAT17(uStack_1e5,
                     CONCAT16(uStack_1d5,
                              CONCAT15(uStack_1e6,
                                       CONCAT14(uStack_1d6,
                                                CONCAT13(uStack_1e7,
                                                         CONCAT12(uStack_1d7,
                                                                  CONCAT11(local_1e8,local_1d8))))))
                    );
  in_RCX[1] = CONCAT17(uStack_1e1,
                       CONCAT16(uStack_1d1,
                                CONCAT15(uStack_1e2,
                                         CONCAT14(uStack_1d2,
                                                  CONCAT13(uStack_1e3,
                                                           CONCAT12(uStack_1d3,
                                                                    CONCAT11(uStack_1e4,uStack_1d4))
                                                          )))));
  return;
}

Assistant:

static WEBP_INLINE void PackAndStore565_SSE2(const __m128i* const R,
                                             const __m128i* const G,
                                             const __m128i* const B,
                                             uint8_t* const dst) {
  const __m128i r0 = _mm_packus_epi16(*R, *R);
  const __m128i g0 = _mm_packus_epi16(*G, *G);
  const __m128i b0 = _mm_packus_epi16(*B, *B);
  const __m128i r1 = _mm_and_si128(r0, _mm_set1_epi8(0xf8));
  const __m128i b1 = _mm_and_si128(_mm_srli_epi16(b0, 3), _mm_set1_epi8(0x1f));
  const __m128i g1 = _mm_srli_epi16(_mm_and_si128(g0, _mm_set1_epi8(0xe0)), 5);
  const __m128i g2 = _mm_slli_epi16(_mm_and_si128(g0, _mm_set1_epi8(0x1c)), 3);
  const __m128i rg = _mm_or_si128(r1, g1);
  const __m128i gb = _mm_or_si128(g2, b1);
#if (WEBP_SWAP_16BIT_CSP == 0)
  const __m128i rgb565 = _mm_unpacklo_epi8(rg, gb);
#else
  const __m128i rgb565 = _mm_unpacklo_epi8(gb, rg);
#endif
  _mm_storeu_si128((__m128i*)dst, rgb565);
}